

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O3

Extension __thiscall spvtools::EnumSet<spvtools::Extension>::Iterator::operator*(Iterator *this)

{
  bool bVar1;
  
  bVar1 = HasEnumAt(this->set_,this->bucketIndex_,(ulong)this->bucketOffset_);
  if (bVar1) {
    return *(Extension *)
            ((long)((this->set_->buckets_).
                    super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                    ._M_impl.super__Vector_impl_data._M_start + this->bucketIndex_) + 8) +
           this->bucketOffset_;
  }
  __assert_fail("set_->HasEnumAt(bucketIndex_, bucketOffset_) && \"operator*() called on an invalid iterator.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/enum_set.h"
                ,0x7f,
                "T spvtools::EnumSet<spvtools::Extension>::Iterator::operator*() const [T = spvtools::Extension]"
               );
}

Assistant:

T operator*() const {
      assert(set_->HasEnumAt(bucketIndex_, bucketOffset_) &&
             "operator*() called on an invalid iterator.");
      return GetValueFromBucket(set_->buckets_[bucketIndex_], bucketOffset_);
    }